

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_doing(Curl_easy *data,_Bool *dophase_done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  ulong in_RAX;
  undefined8 uStack_28;
  
  pcVar1 = data->conn;
  uStack_28 = in_RAX;
  if (((pcVar1->handler->flags & 1) != 0) && ((*(byte *)((long)&pcVar1->proto + 0xe2) & 1) == 0)) {
    uStack_28 = in_RAX & 0xffffffffffffff;
    CVar2 = Curl_conn_connect(data,0,false,(_Bool *)((long)&uStack_28 + 7));
    *(byte *)((long)&pcVar1->proto + 0xe2) =
         *(byte *)((long)&pcVar1->proto + 0xe2) & 0xfe | uStack_28._7_1_;
    if (uStack_28._7_1_ == 0 || CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  CVar2 = Curl_pp_statemach(data,&(pcVar1->proto).ftpc.pp,false,false);
  *dophase_done = (pcVar1->proto).pop3c.state == POP3_STOP;
  return CVar2;
}

Assistant:

static CURLcode pop3_doing(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = pop3_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = pop3_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete"));
  }

  return result;
}